

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CupdlpWrapper.cpp
# Opt level: O3

int formulateLP_highs(HighsLp *lp,double **cost,int *nCols,int *nRows,int *nnz,int *nEqs,
                     int **csc_beg,int **csc_idx,double **csc_val,double **rhs,double **lower,
                     double **upper,double *offset,double *sense_origin,int *nCols_origin,
                     int **constraint_new_idx,int **constraint_type)

{
  size_t __size;
  double dVar1;
  uint uVar2;
  uint uVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer piVar7;
  pointer pdVar8;
  pointer pdVar9;
  pointer pdVar10;
  double *pdVar11;
  double *pdVar12;
  pointer pdVar13;
  double *pdVar14;
  int *piVar15;
  int *piVar16;
  long lVar17;
  double *pdVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  int iVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  double dVar27;
  uint local_98;
  int local_94;
  long local_50;
  
  uVar2 = lp->num_col_;
  uVar24 = (ulong)uVar2;
  uVar3 = lp->num_row_;
  lVar25 = (long)(int)uVar2;
  piVar4 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_94 = piVar4[lVar25];
  *nCols_origin = uVar2;
  *nRows = uVar3;
  *nCols = uVar2;
  *nEqs = 0;
  *nnz = local_94;
  *offset = lp->offset_;
  if (lp->sense_ == kMinimize) {
    dVar27 = 1.0;
  }
  else {
    if (lp->sense_ != kMaximize) goto LAB_002f3994;
    dVar27 = -1.0;
  }
  *sense_origin = dVar27;
LAB_002f3994:
  pdVar5 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar7 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_98 = *nRows;
  local_50 = (long)(int)local_98;
  piVar16 = (int *)malloc(local_50 * 4);
  *constraint_type = piVar16;
  piVar16 = (int *)malloc(local_50 * 4);
  *constraint_new_idx = piVar16;
  if (0 < (int)uVar3) {
    uVar26 = 0;
    do {
      dVar27 = pdVar5[uVar26];
      dVar1 = pdVar6[uVar26];
      if (((1e+20 <= dVar1 || dVar27 <= -1e+20) || (dVar27 != dVar1)) || (NAN(dVar27) || NAN(dVar1))
         ) {
        if ((dVar27 <= -1e+20) || (dVar1 < 1e+20)) {
          if (-1e+20 < dVar27 || 1e+20 <= dVar1) {
            if (1e+20 <= dVar1 || dVar27 <= -1e+20) {
              printf("Warning: constraint %d has no lower and upper bound\n",uVar26 & 0xffffffff);
            }
            (*constraint_type)[uVar26] = 3;
            *nCols = *nCols + 1;
            *nnz = *nnz + 1;
            goto LAB_002f3a9a;
          }
          (*constraint_type)[uVar26] = 1;
        }
        else {
          (*constraint_type)[uVar26] = 2;
        }
      }
      else {
        (*constraint_type)[uVar26] = 0;
LAB_002f3a9a:
        *nEqs = *nEqs + 1;
      }
      uVar26 = uVar26 + 1;
    } while (uVar3 != uVar26);
    local_94 = *nnz;
    local_98 = *nRows;
    local_50 = (long)(int)local_98;
  }
  iVar19 = *nCols;
  lVar17 = (long)iVar19;
  __size = lVar17 * 8;
  pdVar18 = (double *)malloc(__size);
  *cost = pdVar18;
  pdVar18 = (double *)malloc(__size);
  *lower = pdVar18;
  pdVar18 = (double *)malloc(__size);
  *upper = pdVar18;
  piVar16 = (int *)malloc(lVar17 * 4 + 4);
  *csc_beg = piVar16;
  piVar16 = (int *)malloc((long)local_94 * 4);
  *csc_idx = piVar16;
  pdVar18 = (double *)malloc((long)local_94 << 3);
  *csc_val = pdVar18;
  pdVar18 = (double *)malloc(local_50 << 3);
  *rhs = pdVar18;
  if (0 < (int)uVar2) {
    pdVar9 = (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar11 = *cost;
    pdVar12 = *lower;
    pdVar13 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar14 = *upper;
    uVar26 = 0;
    do {
      pdVar11[uVar26] = pdVar9[uVar26] * *sense_origin;
      pdVar12[uVar26] = pdVar10[uVar26];
      pdVar14[uVar26] = pdVar13[uVar26];
      uVar26 = uVar26 + 1;
    } while (uVar24 != uVar26);
  }
  if ((int)uVar2 < iVar19) {
    memset(*cost + lVar25,0,(ulong)(~uVar2 + iVar19) * 8 + 8);
  }
  if (0 < (int)local_98) {
    piVar16 = *constraint_type;
    uVar21 = 0;
    uVar26 = uVar24;
    do {
      if (piVar16[uVar21] == 3) {
        iVar20 = (int)uVar26;
        (*lower)[iVar20] = pdVar5[uVar21];
        (*upper)[iVar20] = pdVar6[uVar21];
        uVar26 = (ulong)(iVar20 + 1);
      }
      uVar21 = uVar21 + 1;
    } while (local_98 != uVar21);
  }
  if (0 < iVar19) {
    pdVar11 = *lower;
    pdVar12 = *upper;
    lVar22 = 0;
    do {
      pdVar14 = pdVar11 + lVar22;
      if (*pdVar14 <= -1e+20 && *pdVar14 != -1e+20) {
        pdVar11[lVar22] = -INFINITY;
      }
      if (1e+20 < pdVar12[lVar22]) {
        pdVar12[lVar22] = INFINITY;
      }
      lVar22 = lVar22 + 1;
    } while (lVar17 != lVar22);
  }
  if (0 < (int)local_98) {
    piVar16 = *constraint_type;
    lVar17 = 0;
    iVar19 = 0;
    do {
      if (piVar16[lVar17] == 3) {
        dVar27 = 0.0;
LAB_002f3ddb:
        pdVar18[iVar19] = dVar27;
        (*constraint_new_idx)[lVar17] = iVar19;
        iVar19 = iVar19 + 1;
      }
      else if (piVar16[lVar17] == 0) {
        dVar27 = pdVar5[lVar17];
        goto LAB_002f3ddb;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < *nRows);
    if (0 < *nRows) {
      iVar19 = *nEqs;
      piVar16 = *constraint_type;
      lVar17 = 0;
      do {
        if (piVar16[lVar17] == 2) {
          dVar27 = pdVar5[lVar17];
LAB_002f3e36:
          pdVar18[iVar19] = dVar27;
          (*constraint_new_idx)[lVar17] = iVar19;
          iVar19 = iVar19 + 1;
        }
        else if (piVar16[lVar17] == 1) {
          dVar27 = -pdVar6[lVar17];
          goto LAB_002f3e36;
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 < *nRows);
    }
  }
  if (-1 < (int)uVar2) {
    piVar16 = *csc_beg;
    lVar17 = 0;
    do {
      piVar16[lVar17] = piVar4[lVar17];
      lVar17 = lVar17 + 1;
    } while (uVar24 + 1 != lVar17);
  }
  if ((int)uVar2 < *nCols) {
    piVar16 = *csc_beg;
    iVar19 = piVar16[lVar25];
    do {
      iVar19 = iVar19 + 1;
      piVar16[lVar25 + 1] = iVar19;
      lVar25 = lVar25 + 1;
    } while (lVar25 < *nCols);
  }
  if (0 < (int)uVar2) {
    piVar16 = *csc_beg;
    iVar19 = *piVar16;
    iVar20 = 0;
    uVar26 = 0;
    do {
      uVar21 = uVar26 + 1;
      iVar23 = piVar16[uVar26 + 1];
      if (iVar19 < iVar23) {
        piVar15 = *constraint_type;
        lVar25 = (long)iVar19;
        do {
          iVar19 = piVar7[lVar25];
          if ((piVar15[iVar19] == 3) || (piVar15[iVar19] == 0)) {
            (*csc_idx)[iVar20] = (*constraint_new_idx)[iVar19];
            (*csc_val)[iVar20] = pdVar8[lVar25];
            iVar20 = iVar20 + 1;
            iVar23 = piVar16[uVar21];
          }
          lVar25 = lVar25 + 1;
        } while (lVar25 < iVar23);
        iVar19 = piVar16[uVar26];
      }
      if (iVar19 < iVar23) {
        piVar15 = *constraint_type;
        lVar25 = (long)iVar19;
        do {
          iVar19 = piVar7[lVar25];
          if (piVar15[iVar19] == 2) {
            (*csc_idx)[iVar20] = (*constraint_new_idx)[iVar19];
            dVar27 = pdVar8[lVar25];
LAB_002f3f8f:
            (*csc_val)[iVar20] = dVar27;
            iVar20 = iVar20 + 1;
          }
          else if (piVar15[iVar19] == 1) {
            (*csc_idx)[iVar20] = (*constraint_new_idx)[iVar19];
            dVar27 = -pdVar8[lVar25];
            goto LAB_002f3f8f;
          }
          lVar25 = lVar25 + 1;
          iVar23 = piVar16[uVar21];
        } while (lVar25 < piVar16[uVar21]);
      }
      iVar19 = iVar23;
      uVar26 = uVar21;
    } while (uVar21 != uVar24);
  }
  iVar19 = *nRows;
  if (0 < iVar19) {
    piVar16 = *constraint_type;
    lVar25 = 0;
    do {
      if (piVar16[lVar25] == 3) {
        piVar15 = *csc_beg;
        iVar19 = (int)uVar24;
        (*csc_idx)[piVar15[iVar19]] = (*constraint_new_idx)[lVar25];
        (*csc_val)[piVar15[iVar19]] = -1.0;
        uVar24 = (ulong)(iVar19 + 1);
        iVar19 = *nRows;
      }
      lVar25 = lVar25 + 1;
    } while (lVar25 < iVar19);
  }
  return 0;
}

Assistant:

int formulateLP_highs(const HighsLp& lp, double** cost, int* nCols, int* nRows,
                      int* nnz, int* nEqs, int** csc_beg, int** csc_idx,
                      double** csc_val, double** rhs, double** lower,
                      double** upper, double* offset, double* sense_origin,
                      int* nCols_origin, int** constraint_new_idx,
                      int** constraint_type) {
  int retcode = 0;

  // problem size for malloc
  int nCols_clp = lp.num_col_;
  int nRows_clp = lp.num_row_;
  int nnz_clp = lp.a_matrix_.start_[lp.num_col_];
  *nCols_origin = nCols_clp;
  *nRows = nRows_clp;    // need not recalculate
  *nCols = nCols_clp;    // need recalculate
  *nEqs = 0;             // need recalculate
  *nnz = nnz_clp;        // need recalculate
  *offset = lp.offset_;  // need not recalculate
  if (lp.sense_ == ObjSense::kMinimize) {
    *sense_origin = 1.0;
  } else if (lp.sense_ == ObjSense::kMaximize) {
    *sense_origin = -1.0;
  }

  const double* lhs_clp = lp.row_lower_.data();
  const double* rhs_clp = lp.row_upper_.data();
  const HighsInt* A_csc_beg = lp.a_matrix_.start_.data();
  const HighsInt* A_csc_idx = lp.a_matrix_.index_.data();
  const double* A_csc_val = lp.a_matrix_.value_.data();
  int has_lower, has_upper;

  cupdlp_init_int(*constraint_type, *nRows);
  cupdlp_init_int(*constraint_new_idx, *nRows);

  // recalculate nRows and nnz for Ax - z = 0
  for (int i = 0; i < nRows_clp; i++) {
    has_lower = lhs_clp[i] > -1e20;
    has_upper = rhs_clp[i] < 1e20;

    // count number of equations and rows
    if (has_lower && has_upper && lhs_clp[i] == rhs_clp[i]) {
      (*constraint_type)[i] = EQ;
      (*nEqs)++;
    } else if (has_lower && !has_upper) {
      (*constraint_type)[i] = GEQ;
    } else if (!has_lower && has_upper) {
      (*constraint_type)[i] = LEQ;
    } else if (has_lower && has_upper) {
      (*constraint_type)[i] = BOUND;
      (*nCols)++;
      (*nnz)++;
      (*nEqs)++;
    } else {
      // printf("Error: constraint %d has no lower and upper bound\n", i);
      // retcode = 1;
      // goto exit_cleanup;

      // what if regard free as bounded
      printf("Warning: constraint %d has no lower and upper bound\n", i);
      (*constraint_type)[i] = BOUND;
      (*nCols)++;
      (*nnz)++;
      (*nEqs)++;
    }
  }

  // allocate memory
  cupdlp_init_double(*cost, *nCols);
  cupdlp_init_double(*lower, *nCols);
  cupdlp_init_double(*upper, *nCols);
  cupdlp_init_int(*csc_beg, *nCols + 1);
  cupdlp_init_int(*csc_idx, *nnz);
  cupdlp_init_double(*csc_val, *nnz);
  cupdlp_init_double(*rhs, *nRows);

  // cost, lower, upper
  for (int i = 0; i < nCols_clp; i++) {
    (*cost)[i] = lp.col_cost_[i] * (*sense_origin);
    (*lower)[i] = lp.col_lower_[i];

    (*upper)[i] = lp.col_upper_[i];
  }
  // slack costs
  for (int i = nCols_clp; i < *nCols; i++) {
    (*cost)[i] = 0.0;
  }
  // slack bounds
  for (int i = 0, j = nCols_clp; i < *nRows; i++) {
    if ((*constraint_type)[i] == BOUND) {
      (*lower)[j] = lhs_clp[i];
      (*upper)[j] = rhs_clp[i];
      j++;
    }
  }

  for (int i = 0; i < *nCols; i++) {
    if ((*lower)[i] < -1e20) (*lower)[i] = -INFINITY;
    if ((*upper)[i] > 1e20) (*upper)[i] = INFINITY;
  }

  // permute LP rhs
  // EQ or BOUND first
  for (int i = 0, j = 0; i < *nRows; i++) {
    if ((*constraint_type)[i] == EQ) {
      (*rhs)[j] = lhs_clp[i];
      (*constraint_new_idx)[i] = j;
      j++;
    } else if ((*constraint_type)[i] == BOUND) {
      (*rhs)[j] = 0.0;
      (*constraint_new_idx)[i] = j;
      j++;
    }
  }
  // then LEQ or GEQ
  for (int i = 0, j = *nEqs; i < *nRows; i++) {
    if ((*constraint_type)[i] == LEQ) {
      (*rhs)[j] = -rhs_clp[i];  // multiply -1
      (*constraint_new_idx)[i] = j;
      j++;
    } else if ((*constraint_type)[i] == GEQ) {
      (*rhs)[j] = lhs_clp[i];
      (*constraint_new_idx)[i] = j;
      j++;
    }
  }

  // formulate and permute LP matrix
  // beg remains the same
  for (int i = 0; i < nCols_clp + 1; i++) (*csc_beg)[i] = A_csc_beg[i];
  for (int i = nCols_clp + 1; i < *nCols + 1; i++)
    (*csc_beg)[i] = (*csc_beg)[i - 1] + 1;

  // row idx changes
  for (int i = 0, k = 0; i < nCols_clp; i++) {
    // same order as in rhs
    // EQ or BOUND first
    for (int j = (*csc_beg)[i]; j < (*csc_beg)[i + 1]; j++) {
      if ((*constraint_type)[A_csc_idx[j]] == EQ ||
          (*constraint_type)[A_csc_idx[j]] == BOUND) {
        (*csc_idx)[k] = (*constraint_new_idx)[A_csc_idx[j]];
        (*csc_val)[k] = A_csc_val[j];
        k++;
      }
    }
    // then LEQ or GEQ
    for (int j = (*csc_beg)[i]; j < (*csc_beg)[i + 1]; j++) {
      if ((*constraint_type)[A_csc_idx[j]] == LEQ) {
        (*csc_idx)[k] = (*constraint_new_idx)[A_csc_idx[j]];
        (*csc_val)[k] = -A_csc_val[j];  // multiply -1
        k++;
      } else if ((*constraint_type)[A_csc_idx[j]] == GEQ) {
        (*csc_idx)[k] = (*constraint_new_idx)[A_csc_idx[j]];
        (*csc_val)[k] = A_csc_val[j];
        k++;
      }
    }
  }

  // slacks for BOUND
  for (int i = 0, j = nCols_clp; i < *nRows; i++) {
    if ((*constraint_type)[i] == BOUND) {
      (*csc_idx)[(*csc_beg)[j]] = (*constraint_new_idx)[i];
      (*csc_val)[(*csc_beg)[j]] = -1.0;
      j++;
    }
  }

  return retcode;
}